

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O1

bool __thiscall SQVM::StringCat(SQVM *this,SQObjectPtr *str,SQObjectPtr *obj,SQObjectPtr *dest)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQSharedState *__n;
  SQSharedState *__n_00;
  SQSharedState *this_00;
  SQTable *pSVar3;
  bool bVar4;
  SQChar *pSVar5;
  SQString *pSVar6;
  SQObjectPtr b;
  SQObjectPtr a;
  SQObjectPtr local_48;
  SQObjectPtr local_38;
  
  local_38.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_38.super_SQObject._type = OT_NULL;
  local_48.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_48.super_SQObject._type = OT_NULL;
  bVar4 = ToString(this,str,&local_38);
  if (bVar4) {
    bVar4 = ToString(this,obj,&local_48);
    if (bVar4) {
      __n = ((local_38.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            _sharedstate;
      __n_00 = ((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
               _sharedstate;
      pSVar5 = SQSharedState::GetScratchPad
                         (this->_sharedstate,
                          (SQInteger)
                          ((long)&__n->_metamethods + (long)((long)&__n_00->_metamethods + 1)));
      memcpy(pSVar5,&(local_38.super_SQObject._unVal.pTable)->_firstfree,(size_t)__n);
      memcpy(pSVar5 + (long)__n,&(local_48.super_SQObject._unVal.pTable)->_firstfree,(size_t)__n_00)
      ;
      this_00 = this->_sharedstate;
      pSVar5 = SQSharedState::GetScratchPad(this_00,-1);
      pSVar6 = SQString::Create(this_00,pSVar5,
                                (long)&__n->_metamethods + (long)&__n_00->_metamethods);
      pSVar3 = (dest->super_SQObject)._unVal.pTable;
      SVar2 = (dest->super_SQObject)._type;
      (dest->super_SQObject)._type = OT_STRING;
      (dest->super_SQObject)._unVal.pString = pSVar6;
      pSVar1 = &(pSVar6->super_SQRefCounted)._uiRef;
      *pSVar1 = *pSVar1 + 1;
      bVar4 = true;
      if ((SVar2 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2]
          )();
        }
      }
      goto LAB_0015a395;
    }
  }
  bVar4 = false;
LAB_0015a395:
  SQObjectPtr::~SQObjectPtr(&local_48);
  SQObjectPtr::~SQObjectPtr(&local_38);
  return bVar4;
}

Assistant:

bool SQVM::StringCat(const SQObjectPtr &str,const SQObjectPtr &obj,SQObjectPtr &dest)
{
    SQObjectPtr a, b;
    if(!ToString(str, a)) return false;
    if(!ToString(obj, b)) return false;
    SQInteger l = _string(a)->_len , ol = _string(b)->_len;
    SQChar *s = _sp(sq_rsl(l + ol + 1));
    memcpy(s, _stringval(a), sq_rsl(l));
    memcpy(s + l, _stringval(b), sq_rsl(ol));
    dest = SQString::Create(_ss(this), _spval, l + ol);
    return true;
}